

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_stat(char *path,cs_stat_t *st)

{
  int iVar1;
  
  iVar1 = stat64(path,(stat64 *)st);
  return iVar1;
}

Assistant:

int mg_stat(const char *path, cs_stat_t *st) {
#ifdef _WIN32
                                                                                                                            wchar_t wpath[MAX_PATH_SIZE];
  to_wchar(path, wpath, ARRAY_SIZE(wpath));
  DBG(("[%ls] -> %d", wpath, _wstati64(wpath, st)));
  return _wstati64(wpath, (struct _stati64 *) st);
#else
    return stat(path, st);
#endif
}